

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::Str::cStringCaseEq(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  int c2;
  int c1;
  int d;
  char *s2_local;
  char *s1_local;
  
  if ((s1 == (char *)0x0) && (s2 == (char *)0x0)) {
    s1_local._7_1_ = true;
  }
  else if ((s1 == (char *)0x0) || (_c1 = s2, s2_local = s1, s2 == (char *)0x0)) {
    s1_local._7_1_ = false;
  }
  else {
    do {
      iVar1 = toupper((int)*s2_local);
      iVar2 = toupper((int)*_c1);
      if (iVar1 != iVar2) break;
      _c1 = _c1 + 1;
      s2_local = s2_local + 1;
    } while (iVar2 != 0);
    s1_local._7_1_ = iVar1 == iVar2;
  }
  return s1_local._7_1_;
}

Assistant:

bool Str::cStringCaseEq(const char* s1, const char* s2) {
  if (s1 == nullptr && s2 == nullptr) return true;
  if (s1 == nullptr || s2 == nullptr) return false;

  // With thanks to cygwin for this code
  int d = 0;

  while (true) {
    const int c1 = toupper(*s1++);
    const int c2 = toupper(*s2++);

    if (((d = c1 - c2) != 0) || (c2 == '\0')) {
      break;
    }
  }

  return d == 0;
}